

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O0

void envy_bios_print_spreadspectrum(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  envy_bios_spreadspectrum *peVar2;
  envy_bios_spreadspectrum_entry *peVar3;
  envy_bios_spreadspectrum_entry *entry;
  uint spread;
  int i;
  envy_bios_spreadspectrum *spreadspectrum;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar2 = &bios->spreadspectrum;
  if ((peVar2->offset != 0) && ((mask & 0x400000) != 0)) {
    if ((bios->spreadspectrum).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n\n",
              (ulong)peVar2->offset,(ulong)(uint)((int)(uint)(bios->spreadspectrum).version >> 4),
              (ulong)((bios->spreadspectrum).version & 0xf));
    }
    else {
      fprintf((FILE *)out,"SPREADSPECTRUM table at 0x%04x version %d.%d",(ulong)peVar2->offset,
              (ulong)(uint)((int)(uint)(bios->spreadspectrum).version >> 4),
              (ulong)((bios->spreadspectrum).version & 0xf));
      if ((bios->spreadspectrum).version < 0x41) {
        fprintf((FILE *)out," unk04 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x\n",
                (ulong)(bios->spreadspectrum).unk04,(ulong)(bios->spreadspectrum).unk05,
                (ulong)(bios->spreadspectrum).unk06,(ulong)(bios->spreadspectrum).unk07,
                (uint)(bios->spreadspectrum).unk08,(uint)(bios->spreadspectrum).unk09);
      }
      else {
        fprintf((FILE *)out," unk04 0x%02x\n",(ulong)(bios->spreadspectrum).unk04);
      }
      envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)(bios->spreadspectrum).hlen,mask);
      for (entry._4_4_ = 0; (int)entry._4_4_ < (int)(uint)(bios->spreadspectrum).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar3 = (bios->spreadspectrum).entries + (int)entry._4_4_;
        envy_bios_dump_hex(bios,out,(uint)peVar3->offset,(uint)(bios->spreadspectrum).rlen,mask);
        if ((peVar3->unk00 & 1) == 0) {
          fprintf((FILE *)out,"SPREADSPECTRUM %d: INVALID 0x%02x",(ulong)entry._4_4_,
                  (ulong)peVar3->unk00);
          if (1 < (bios->spreadspectrum).rlen) {
            fprintf((FILE *)out," 0x%02x",(ulong)peVar3->unk01);
          }
        }
        else {
          fprintf((FILE *)out,"SPREADSPECTRUM %d: ",(ulong)entry._4_4_);
          fprintf((FILE *)out,"idx(%1x) ",(ulong)((peVar3->unk00 & 0x10) >> 4));
          switch(peVar3->unk00 & 6) {
          case 0:
            fprintf((FILE *)out,"SRC_INTERNAL_0 ");
            break;
          case 2:
            fprintf((FILE *)out,"SRC_INTERNAL_1 ");
            break;
          case 4:
            fprintf((FILE *)out,"SRC_EXTERNAL ");
            break;
          case 6:
            fprintf((FILE *)out,"SRC_PLL ");
          }
          uVar1 = (peVar3->unk01 & 0x3f) * 5;
          fprintf((FILE *)out,"SPREAD(%d.%02d%%) ",(ulong)(uVar1 / 100),(ulong)uVar1 % 100);
          if ((peVar3->unk01 & 0x70) == 0) {
            fprintf((FILE *)out,"CENTER");
          }
          else {
            fprintf((FILE *)out,"DOWN");
          }
        }
        fprintf((FILE *)out,"\n");
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_spreadspectrum (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_spreadspectrum *spreadspectrum = &bios->spreadspectrum;
	if (!spreadspectrum->offset || !(mask & ENVY_BIOS_PRINT_DUNK))
		return;
	if (!spreadspectrum->valid) {
		fprintf(out, "Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n\n", spreadspectrum->offset, spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
		return;
	}
	fprintf(out, "SPREADSPECTRUM table at 0x%04x version %d.%d", spreadspectrum->offset, spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
	if (spreadspectrum->version < 0x41) {
		fprintf (out, " unk04 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x\n", spreadspectrum->unk04, spreadspectrum->unk05, spreadspectrum->unk06, spreadspectrum->unk07, spreadspectrum->unk08, spreadspectrum->unk09);
	} else {
		fprintf (out, " unk04 0x%02x\n", spreadspectrum->unk04);
	}
	envy_bios_dump_hex(bios, out, spreadspectrum->offset, spreadspectrum->hlen, mask);
	int i;
	for (i = 0; i < spreadspectrum->entriesnum; i++) {
		unsigned int spread;
		struct envy_bios_spreadspectrum_entry *entry = &spreadspectrum->entries[i];
		envy_bios_dump_hex(bios, out, entry->offset, spreadspectrum->rlen, mask);
		if(!(entry->unk00 & 0x1)) {
			fprintf(out, "SPREADSPECTRUM %d: INVALID 0x%02x", i, entry->unk00);
						
			if (spreadspectrum->rlen >= 2)
				fprintf(out, " 0x%02x", entry->unk01);
		} else {
			fprintf(out, "SPREADSPECTRUM %d: ", i);
			fprintf(out, "idx(%1x) ", (entry->unk00 & 0x10) >> 4);
			switch(entry->unk00 & 0x6) {
			case 0x0:
				fprintf(out, "SRC_INTERNAL_0 ");
				break;
			case 0x2:
				fprintf(out, "SRC_INTERNAL_1 ");
				break;
			case 0x4:
				fprintf(out, "SRC_EXTERNAL ");
				break;
			case 0x6:
				fprintf(out, "SRC_PLL ");
				break;
			}
			spread = (entry->unk01 & 0x3f) * 5;
			fprintf(out, "SPREAD(%d.%02d%%) ", spread / 100, spread % 100);
			
			if(entry->unk01 & 0x70)
				fprintf(out, "DOWN");
			else
				fprintf(out, "CENTER");
		}
		fprintf(out, "\n");
	}
	fprintf(out, "\n");
}